

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

node_stats __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
::internal_stats(btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 *this,node_type *node)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *node_00;
  node_stats local_40;
  int local_2c;
  node_type *pnStack_28;
  int i;
  node_type *node_local;
  btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *this_local;
  node_stats res;
  
  pnStack_28 = node;
  node_local = (node_type *)this;
  if (node == (node_type *)0x0) {
    node_stats::node_stats((node_stats *)&this_local,0,0);
  }
  else {
    bVar2 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
            ::leaf(node);
    if (bVar2) {
      node_stats::node_stats((node_stats *)&this_local,1,0);
    }
    else {
      node_stats::node_stats((node_stats *)&this_local,0,1);
      for (local_2c = 0; iVar1 = local_2c,
          bVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  ::count(pnStack_28), iVar1 <= (int)(uint)bVar3; local_2c = local_2c + 1) {
        node_00 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                  ::child(pnStack_28,local_2c);
        local_40 = internal_stats(this,node_00);
        node_stats::operator+=((node_stats *)&this_local,&local_40);
      }
    }
  }
  return _this_local;
}

Assistant:

node_stats internal_stats(const node_type *node) const {
    if (!node) {
      return node_stats(0, 0);
    }
    if (node->leaf()) {
      return node_stats(1, 0);
    }
    node_stats res(0, 1);
    for (int i = 0; i <= node->count(); ++i) {
      res += internal_stats(node->child(i));
    }
    return res;
  }